

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setFederateTag
          (CommonCore *this,LocalFederateId fid,string_view tag,string_view value)

{
  string_view string2;
  string_view message;
  string_view string1;
  string_view message_00;
  string_view tag_00;
  bool bVar1;
  int iVar2;
  GlobalBrokerId id;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  FederateState *pFVar3;
  undefined8 uVar4;
  FederateState *in_RCX;
  BaseType in_ESI;
  ActionMessage *in_RDI;
  FederateState *fed;
  ActionMessage tagcmd;
  BrokerBase *in_stack_fffffffffffffe48;
  BrokerBase *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  allocator<char> *paVar5;
  allocator<char> *in_stack_fffffffffffffe80;
  CommonCore *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  LocalFederateId federateID;
  string_view in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  GlobalFederateId local_11c [3];
  BaseType local_110;
  BaseType local_108;
  undefined4 local_5c;
  allocator<char> local_31 [25];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  LocalFederateId local_4;
  
  paVar5 = (allocator<char> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  local_18._M_str = (char *)in_RCX;
  local_4.fid = in_ESI;
  if (setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                                 ::trueString_abi_cxx11_);
    paVar5 = (allocator<char> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    if (iVar2 != 0) {
      paVar5 = local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
      std::allocator<char>::~allocator(local_31);
      __cxa_atexit(std::__cxx11::string::~string,
                   &setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                    ::trueString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&setFederateTag(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                           ::trueString_abi_cxx11_);
    }
  }
  federateID.fid = (BaseType)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    local_5c = 0xfffffefd;
    bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
    if (bVar1) {
      ActionMessage::ActionMessage(in_RDI,(action_t)((ulong)paVar5 >> 0x20));
      id = BrokerBase::getGlobalId(in_stack_fffffffffffffe48);
      GlobalFederateId::GlobalFederateId(local_11c,id);
      local_110 = local_11c[0].gid;
      local_108 = local_11c[0].gid;
      string1._M_str = (char *)in_RDI;
      string1._M_len = (size_t)paVar5;
      string2._M_len._4_4_ = id.gid;
      string2._M_len._0_4_ = in_stack_fffffffffffffe58;
      string2._M_str = (char *)in_stack_fffffffffffffe60;
      ActionMessage::setStringData((ActionMessage *)in_stack_fffffffffffffe50,string1,string2);
      BrokerBase::addActionMessage
                (in_stack_fffffffffffffe50,(ActionMessage *)in_stack_fffffffffffffe48);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe50);
    }
    else {
      pFVar3 = getFederateAt(in_stack_fffffffffffffe88,federateID);
      if (pFVar3 == (FederateState *)0x0) {
        uVar4 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe60,
                   (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        message_00._M_str = (char *)in_RDI;
        message_00._M_len = (size_t)paVar5;
        InvalidIdentifier::InvalidIdentifier
                  ((InvalidIdentifier *)in_stack_fffffffffffffe60,message_00);
        __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
      }
      tag_00._M_len._4_4_ = local_4.fid;
      tag_00._M_len._0_4_ = in_stack_fffffffffffffea8;
      tag_00._M_str = (char *)pFVar3;
      FederateState::setTag((FederateState *)local_18._M_str,tag_00,in_stack_fffffffffffffe98);
    }
    return;
  }
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,(char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  message._M_str = (char *)in_RDI;
  message._M_len = (size_t)paVar5;
  InvalidParameter::InvalidParameter((InvalidParameter *)this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void CommonCore::setFederateTag(LocalFederateId fid, std::string_view tag, std::string_view value)
{
    static const std::string trueString{"true"};
    if (tag.empty()) {
        throw InvalidParameter("tag cannot be an empty string for setFederateTag");
    }

    if (fid == gLocalCoreId) {
        ActionMessage tagcmd(CMD_CORE_TAG);
        tagcmd.source_id = getGlobalId();
        tagcmd.dest_id = tagcmd.source_id;
        tagcmd.setStringData(tag, value);
        addActionMessage(std::move(tagcmd));
        return;
    }

    auto* fed = getFederateAt(fid);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (setFederateTag)"));
    }
    fed->setTag(tag, value);
}